

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout_p.h
# Opt level: O1

QMainWindowLayoutState * __thiscall
QMainWindowLayoutState::operator=(QMainWindowLayoutState *this,QMainWindowLayoutState *param_1)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  bool *pbVar3;
  bool *pbVar4;
  QToolBarAreaLayoutLine *pQVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  QLayoutItem *pQVar8;
  QMainWindow *pQVar9;
  undefined8 uVar10;
  QTabBar *pQVar11;
  Representation RVar12;
  Representation RVar13;
  Representation RVar14;
  Representation RVar15;
  Representation RVar16;
  Representation RVar17;
  Representation RVar18;
  Representation RVar19;
  QArrayDataPointer<QToolBarAreaLayoutLine> *other;
  long lVar20;
  QArrayDataPointer<QToolBarAreaLayoutLine> *this_00;
  
  this->mainWindow = param_1->mainWindow;
  RVar12.m_i = (param_1->rect).y1.m_i;
  RVar13.m_i = (param_1->rect).x2.m_i;
  RVar14.m_i = (param_1->rect).y2.m_i;
  (this->rect).x1 = (Representation)(param_1->rect).x1.m_i;
  (this->rect).y1 = (Representation)RVar12.m_i;
  (this->rect).x2 = (Representation)RVar13.m_i;
  (this->rect).y2 = (Representation)RVar14.m_i;
  RVar12.m_i = (param_1->toolBarAreaLayout).rect.y1.m_i;
  RVar13.m_i = (param_1->toolBarAreaLayout).rect.x2.m_i;
  RVar14.m_i = (param_1->toolBarAreaLayout).rect.y2.m_i;
  (this->toolBarAreaLayout).rect.x1 = (Representation)(param_1->toolBarAreaLayout).rect.x1.m_i;
  (this->toolBarAreaLayout).rect.y1 = (Representation)RVar12.m_i;
  (this->toolBarAreaLayout).rect.x2 = (Representation)RVar13.m_i;
  (this->toolBarAreaLayout).rect.y2 = (Representation)RVar14.m_i;
  (this->toolBarAreaLayout).mainWindow = (param_1->toolBarAreaLayout).mainWindow;
  this_00 = (QArrayDataPointer<QToolBarAreaLayoutLine> *)(this->toolBarAreaLayout).docks;
  other = (QArrayDataPointer<QToolBarAreaLayoutLine> *)(param_1->toolBarAreaLayout).docks;
  lVar20 = 4;
  do {
    QArrayDataPointer<QToolBarAreaLayoutLine>::operator=(this_00,other);
    pQVar5 = other[1].ptr;
    uVar6 = *(undefined8 *)((long)&other[1].ptr + 1);
    uVar7 = *(undefined8 *)((long)&other[1].size + 1);
    this_00[1].d = other[1].d;
    this_00[1].ptr = pQVar5;
    *(undefined8 *)((long)&this_00[1].ptr + 1) = uVar6;
    *(undefined8 *)((long)&this_00[1].size + 1) = uVar7;
    other = (QArrayDataPointer<QToolBarAreaLayoutLine> *)&other[2].ptr;
    this_00 = (QArrayDataPointer<QToolBarAreaLayoutLine> *)&this_00[2].ptr;
    lVar20 = lVar20 + -1;
  } while (lVar20 != 0);
  (this->toolBarAreaLayout).visible = (param_1->toolBarAreaLayout).visible;
  uVar6 = *(undefined8 *)((param_1->dockAreaLayout).corners + 2);
  RVar12.m_i = (param_1->dockAreaLayout).rect.x1.m_i;
  RVar13.m_i = (param_1->dockAreaLayout).rect.y1.m_i;
  RVar14.m_i = (param_1->dockAreaLayout).rect.x2.m_i;
  RVar15.m_i = (param_1->dockAreaLayout).rect.y2.m_i;
  pQVar8 = (param_1->dockAreaLayout).centralWidgetItem;
  pQVar9 = (param_1->dockAreaLayout).mainWindow;
  RVar16.m_i = (param_1->dockAreaLayout).centralWidgetRect.x1.m_i;
  RVar17.m_i = (param_1->dockAreaLayout).centralWidgetRect.y1.m_i;
  RVar18.m_i = (param_1->dockAreaLayout).centralWidgetRect.x2.m_i;
  RVar19.m_i = (param_1->dockAreaLayout).centralWidgetRect.y2.m_i;
  *(undefined8 *)(this->dockAreaLayout).corners = *(undefined8 *)(param_1->dockAreaLayout).corners;
  *(undefined8 *)((this->dockAreaLayout).corners + 2) = uVar6;
  (this->dockAreaLayout).rect.x1 = (Representation)RVar12.m_i;
  (this->dockAreaLayout).rect.y1 = (Representation)RVar13.m_i;
  (this->dockAreaLayout).rect.x2 = (Representation)RVar14.m_i;
  (this->dockAreaLayout).rect.y2 = (Representation)RVar15.m_i;
  (this->dockAreaLayout).centralWidgetItem = pQVar8;
  (this->dockAreaLayout).mainWindow = pQVar9;
  (this->dockAreaLayout).centralWidgetRect.x1 = (Representation)RVar16.m_i;
  (this->dockAreaLayout).centralWidgetRect.y1 = (Representation)RVar17.m_i;
  (this->dockAreaLayout).centralWidgetRect.x2 = (Representation)RVar18.m_i;
  (this->dockAreaLayout).centralWidgetRect.y2 = (Representation)RVar19.m_i;
  lVar20 = 0;
  do {
    *(undefined8 *)((long)&(this->dockAreaLayout).docks[0].sep + lVar20) =
         *(undefined8 *)((long)&(param_1->dockAreaLayout).docks[0].sep + lVar20);
    QArrayDataPointer<QWidget_*>::operator=
              ((QArrayDataPointer<QWidget_*> *)
               ((long)&(this->dockAreaLayout).docks[0].separatorWidgets.d.d + lVar20),
               (QArrayDataPointer<QWidget_*> *)
               ((long)&(param_1->dockAreaLayout).docks[0].separatorWidgets.d.d + lVar20));
    puVar1 = (undefined8 *)((long)&(param_1->dockAreaLayout).docks[0].dockPos + lVar20);
    uVar6 = puVar1[1];
    puVar2 = (undefined8 *)((long)&(param_1->dockAreaLayout).docks[0].rect.x2.m_i + lVar20);
    uVar7 = *puVar2;
    uVar10 = puVar2[1];
    puVar2 = (undefined8 *)((long)&(this->dockAreaLayout).docks[0].dockPos + lVar20);
    *puVar2 = *puVar1;
    puVar2[1] = uVar6;
    puVar1 = (undefined8 *)((long)&(this->dockAreaLayout).docks[0].rect.x2.m_i + lVar20);
    *puVar1 = uVar7;
    puVar1[1] = uVar10;
    QArrayDataPointer<QDockAreaLayoutItem>::operator=
              ((QArrayDataPointer<QDockAreaLayoutItem> *)
               ((long)&(this->dockAreaLayout).docks[0].item_list.d.d + lVar20),
               (QArrayDataPointer<QDockAreaLayoutItem> *)
               ((long)&(param_1->dockAreaLayout).docks[0].item_list.d.d + lVar20));
    pbVar3 = &(param_1->dockAreaLayout).docks[0].tabbed + lVar20;
    pQVar11 = *(QTabBar **)(pbVar3 + 8);
    pbVar4 = &(this->dockAreaLayout).docks[0].tabbed + lVar20;
    *(undefined8 *)pbVar4 = *(undefined8 *)pbVar3;
    *(QTabBar **)(pbVar4 + 8) = pQVar11;
    *(undefined4 *)((long)&(this->dockAreaLayout).docks[0].tabBarShape + lVar20) =
         *(undefined4 *)((long)&(param_1->dockAreaLayout).docks[0].tabBarShape + lVar20);
    lVar20 = lVar20 + 0x70;
  } while (lVar20 != 0x1c0);
  (this->dockAreaLayout).fallbackToSizeHints = (param_1->dockAreaLayout).fallbackToSizeHints;
  (this->dockAreaLayout).sep = (param_1->dockAreaLayout).sep;
  QArrayDataPointer<QWidget_*>::operator=
            (&(this->dockAreaLayout).separatorWidgets.d,
             &(param_1->dockAreaLayout).separatorWidgets.d);
  return this;
}

Assistant:

class Q_AUTOTEST_EXPORT QMainWindowLayoutState
{
public:
    QRect rect;
    QMainWindow *mainWindow;

    QMainWindowLayoutState(QMainWindow *win);

#if QT_CONFIG(toolbar)
    QToolBarAreaLayout toolBarAreaLayout;
#endif

#if QT_CONFIG(dockwidget)
    QDockAreaLayout dockAreaLayout;
#else
    QLayoutItem *centralWidgetItem;
    QRect centralWidgetRect;
#endif

    void apply(bool animated);
    void deleteAllLayoutItems();
    void deleteCentralWidgetItem();

    QSize sizeHint() const;
    QSize minimumSize() const;
    bool fits() const;
    void fitLayout();

    QLayoutItem *itemAt(int index, int *x) const;
    QLayoutItem *takeAt(int index, int *x);
    QList<int> indexOf(QWidget *widget) const;
    QLayoutItem *item(const QList<int> &path);
    QRect itemRect(const QList<int> &path) const;
    QRect gapRect(const QList<int> &path) const; // ### get rid of this, use itemRect() instead

    bool contains(QWidget *widget) const;

    void setCentralWidget(QWidget *widget);
    QWidget *centralWidget() const;

    QList<int> gapIndex(QWidget *widget, const QPoint &pos) const;
    bool insertGap(const QList<int> &path, QLayoutItem *item);
    void remove(const QList<int> &path);
    void remove(QLayoutItem *item);
    void clear();
    bool isValid() const;

    QLayoutItem *plug(const QList<int> &path);
    QLayoutItem *unplug(const QList<int> &path, QMainWindowLayoutState *savedState = nullptr);

    void saveState(QDataStream &stream) const;
    bool checkFormat(QDataStream &stream);
    bool restoreState(QDataStream &stream, const QMainWindowLayoutState &oldState);
}